

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

void __thiscall Js::DynamicObject::SetIsPrototype(DynamicObject *this)

{
  byte bVar1;
  Type *pTVar2;
  long *plVar3;
  DynamicTypeHandler *this_00;
  Type *pTVar4;
  code *pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  anon_union_8_2_815e7e51_for_DynamicObject_2 aVar10;
  
  pTVar2 = (this->super_RecyclableObject).type.ptr;
  plVar3 = *(long **)(pTVar2 + 1);
  bVar1 = *(byte *)((long)plVar3 + 9);
  if (DAT_015d6345 == '\x01') {
    cVar6 = (**(code **)(*plVar3 + 0x2a0))(plVar3);
    if (((cVar6 != '\0') && ((bVar1 & 0x20) != 0)) && ((*(byte *)((long)plVar3 + 9) & 0x18) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x2aa,
                                  "(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype)"
                                  ,
                                  "!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype"
                                 );
      if (!bVar7) goto LAB_00dbfab7;
      *puVar9 = 0;
    }
  }
  if ((*(byte *)((long)plVar3 + 9) & 0x30) == 0x20) {
    bVar7 = HasObjectArray(this);
    if ((bVar7) && (this->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0)) {
      bVar7 = HasObjectArray(this);
      if (bVar7) {
        aVar10 = this->field_1;
      }
      else {
        aVar10 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
      }
      if ((*(byte *)(*(long *)(*(long *)((long)aVar10 + 8) + 0x28) + 9) & 0x20) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x2b1,
                                    "(this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0)"
                                    ,
                                    "this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0"
                                   );
        if (!bVar7) goto LAB_00dbfab7;
        *puVar9 = 0;
      }
    }
  }
  else {
    (**(code **)(*plVar3 + 0x290))(plVar3,this);
    this_00 = *(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1);
    bVar7 = HasObjectArray(this);
    if (*(long **)&(this->field_1).field_1 != (long *)0x0 && bVar7) {
      (**(code **)(**(long **)&(this->field_1).field_1 + 800))();
    }
    iVar8 = (*this_00->_vptr_DynamicTypeHandler[0x53])(this_00);
    if ((char)iVar8 == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x2c1,"(currentTypeHandler->SupportsPrototypeInstances())",
                                  "currentTypeHandler->SupportsPrototypeInstances()");
      if (!bVar7) goto LAB_00dbfab7;
      *puVar9 = 0;
    }
    if (DAT_015d6345 == '\x01') {
      iVar8 = (*this_00->_vptr_DynamicTypeHandler[0x54])(this_00);
      if (((char)iVar8 != '\0') && ((this_00->flags & 0x18) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x2c2,
                                    "(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared())"
                                    ,
                                    "!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared()"
                                   );
        if (!bVar7) goto LAB_00dbfab7;
        *puVar9 = 0;
      }
    }
    if (((bVar1 & 0x30) != 0x20) && (DAT_015d6346 == '\x01')) {
      iVar8 = (*this_00->_vptr_DynamicTypeHandler[0x55])(this_00);
      if (((char)iVar8 != '\0') && ((this->super_RecyclableObject).type.ptr == pTVar2)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x2c3,
                                    "((wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType)"
                                    ,
                                    "(wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType"
                                   );
        if (!bVar7) {
LAB_00dbfab7:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
    }
    pTVar4 = (this->super_RecyclableObject).type.ptr;
    if (pTVar4 == pTVar2) {
      DynamicTypeHandler::InvalidateStoreFieldCachesForAllProperties
                (this_00,(((pTVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                         scriptContext.ptr);
      return;
    }
  }
  return;
}

Assistant:

void DynamicObject::SetIsPrototype()
    {
        DynamicTypeHandler* currentTypeHandler = this->GetTypeHandler();
        Js::DynamicType* oldType = this->GetDynamicType();

#if DBG
        bool wasShared = currentTypeHandler->GetIsShared();
        bool wasPrototype = (currentTypeHandler->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0;
        Assert(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype);
#endif

        // If this handler is not shared and it already has a prototype flag then we must have taken the required
        // type transition (if any) earlier when the singleton object first became a prototype.
        if ((currentTypeHandler->GetFlags() & (DynamicTypeHandler::IsSharedFlag | DynamicTypeHandler::IsPrototypeFlag)) == DynamicTypeHandler::IsPrototypeFlag)
        {
            Assert(this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0);
            return;
        }

        currentTypeHandler->SetIsPrototype(this);
        // Get type handler again, in case it got changed by SetIsPrototype.
        currentTypeHandler = this->GetTypeHandler();

        // Set the object array as a prototype as well, so if it is an ES5 array, we will disable the array set element fast path
        ArrayObject * objectArray = this->GetObjectArray();
        if (objectArray)
        {
            objectArray->SetIsPrototype();
        }

#if DBG
        Assert(currentTypeHandler->SupportsPrototypeInstances());
        Assert(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared());
        Assert((wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType);
#endif

        // If we haven't changed type we must explicitly invalidate store field inline caches to avoid properties
        // getting added to this prototype object on the fast path without proper invalidation.
        if (this->GetDynamicType() == oldType)
        {
            currentTypeHandler->InvalidateStoreFieldCachesForAllProperties(this->GetScriptContext());
        }
    }